

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_69b37::MpPursuer::update(MpPursuer *this,float currentTime,float elapsedTime)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  Vec3 local_30;
  Vec3 local_20;
  
  fVar1 = elapsedTime;
  uVar4 = (**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))();
  local_30.z = fVar1;
  local_30.x = (float)(int)uVar4;
  local_30.y = (float)(int)((ulong)uVar4 >> 0x20);
  local_20._0_8_ =
       (**(code **)((long)(this->wanderer->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))();
  local_20.z = fVar1;
  fVar1 = OpenSteer::Vec3::distance(&local_30,&local_20);
  fVar2 = (float)(**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  fVar3 = (float)(**(code **)((long)(this->wanderer->super_MpBase).super_SimpleVehicle.
                                    super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))();
  if (fVar1 < fVar3 + fVar2) {
    reset(this);
  }
  local_30 = OpenSteer::
             SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
             ::steerForPursuit((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                *)this,(AbstractVehicle *)this->wanderer,20.0);
  fVar1 = local_30.z;
  OpenSteer::SimpleVehicle::applySteeringForce((SimpleVehicle *)this,&local_30,elapsedTime);
  uVar4 = (**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
  local_30.z = fVar1;
  local_30.x = (float)(int)uVar4;
  local_30.y = (float)(int)((ulong)uVar4 >> 0x20);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                    ,currentTime,&local_30);
  return;
}

Assistant:

void update (const float currentTime, const float elapsedTime)
        {
            // when pursuer touches quarry ("wanderer"), reset its position
            const float d = Vec3::distance (position(), wanderer->position());
            const float r = radius() + wanderer->radius();
            if (d < r) reset ();

            const float maxTime = 20; // xxx hard-to-justify value
            applySteeringForce (steerForPursuit (*wanderer, maxTime), elapsedTime);

            // for annotation
            recordTrailVertex (currentTime, position());
        }